

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O1

int uncompress2file(char *filename,FILE *indiskfile,FILE *outdiskfile,int *status)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  size_t sVar2;
  ulong uVar3;
  z_stream d_stream;
  void *local_a0;
  int local_98;
  void *local_88;
  undefined4 local_80;
  ulong local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  if (0 < *status) {
    return *status;
  }
  __ptr = malloc(0x1c200);
  if ((__ptr == (void *)0x0) || (__ptr_00 = malloc(0x1c200), __ptr_00 == (void *)0x0)) {
    *status = 0x71;
    iVar1 = 0x71;
  }
  else {
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    local_80 = 0x1c200;
    local_88 = __ptr_00;
    iVar1 = inflateInit2_(&local_a0,0x1f,"1.2.11",0x70);
    if (iVar1 == 0) {
      uVar3 = 0;
      do {
        sVar2 = fread(__ptr,1,0x1c200,(FILE *)indiskfile);
        iVar1 = ferror((FILE *)indiskfile);
        if (iVar1 != 0) {
          inflateEnd(&local_a0);
          goto LAB_001c0d3b;
        }
        if ((int)sVar2 == 0) break;
        local_a0 = __ptr;
        local_98 = (int)sVar2;
        while ((iVar1 = inflate(&local_a0,0), iVar1 == -5 || (iVar1 == 0))) {
          if (local_98 == 0) goto LAB_001c0ca6;
          sVar2 = fwrite(__ptr_00,1,0x1c200,(FILE *)outdiskfile);
          if ((int)sVar2 != 0x1c200) goto LAB_001c0d2e;
          uVar3 = uVar3 + 0x1c200;
          local_80 = 0x1c200;
          local_88 = __ptr_00;
        }
        if (iVar1 != 1) goto LAB_001c0d2e;
LAB_001c0ca6:
        iVar1 = feof((FILE *)indiskfile);
      } while (iVar1 == 0);
      if ((local_78 < uVar3 || local_78 - uVar3 == 0) ||
         (sVar2 = fwrite(__ptr_00,1,local_78 - uVar3,(FILE *)outdiskfile),
         (long)(int)sVar2 == local_78 - uVar3)) {
        free(__ptr);
        free(__ptr_00);
        iVar1 = inflateEnd(&local_a0);
        if (iVar1 == 0) {
          return *status;
        }
      }
      else {
LAB_001c0d2e:
        inflateEnd(&local_a0);
LAB_001c0d3b:
        free(__ptr);
        free(__ptr_00);
      }
    }
    *status = 0x19e;
    iVar1 = 0x19e;
  }
  return iVar1;
}

Assistant:

int uncompress2file(char *filename,  /* name of input file                  */
             FILE *indiskfile,     /* I - input file pointer                */
             FILE *outdiskfile,    /* I - output file pointer               */
             int *status)        /* IO - error status                       */
/*
  Uncompress the file into another file. 
*/
{
    int err, len;
    unsigned long bytes_out = 0;
    char *infilebuff, *outfilebuff;
    z_stream d_stream;   /* decompression stream */

    if (*status > 0) 
        return(*status); 

    /* Allocate buffers to hold compressed and uncompressed */
    infilebuff = (char*)malloc(GZBUFSIZE);
    if (!infilebuff) return(*status = 113); /* memory error */

    outfilebuff = (char*)malloc(GZBUFSIZE);
    if (!outfilebuff) return(*status = 113); /* memory error */

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;

    d_stream.next_out = (unsigned char*) outfilebuff;
    d_stream.avail_out = GZBUFSIZE;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */

    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    /* loop through the file, reading a buffer and uncompressing it */
    for (;;)
    {
        len = fread(infilebuff, 1, GZBUFSIZE, indiskfile);
	if (ferror(indiskfile)) {
              inflateEnd(&d_stream);
              free(infilebuff);
              free(outfilebuff);
              return(*status = 414);
	}

        if (len == 0) break;  /* no more data */

        d_stream.next_in = (unsigned char*)infilebuff;
        d_stream.avail_in = len;

        for (;;) {
            /* uncompress as much of the input as will fit in the output */
            err = inflate(&d_stream, Z_NO_FLUSH);

            if (err == Z_STREAM_END ) { /* We reached the end of the input */
	        break; 
            } else if (err == Z_OK || err == Z_BUF_ERROR) { 
	        /* Z_BUF_ERROR means need more input data to make progress */

                if (!d_stream.avail_in) break; /* need more input */
		
                /* flush out the full output buffer */
                if ((int)fwrite(outfilebuff, 1, GZBUFSIZE, outdiskfile) != GZBUFSIZE) {
                    inflateEnd(&d_stream);
                    free(infilebuff);
                    free(outfilebuff);
                    return(*status = 414);
                }
                bytes_out += GZBUFSIZE;
                d_stream.next_out = (unsigned char*) outfilebuff;
                d_stream.avail_out = GZBUFSIZE;

            } else {  /* some other error */
                inflateEnd(&d_stream);
                free(infilebuff);
                free(outfilebuff);
                return(*status = 414);
            }
        }
	
	if (feof(indiskfile))  break;
    }

    /* write out any remaining bytes in the buffer */
    if (d_stream.total_out > bytes_out) {
        if ((int)fwrite(outfilebuff, 1, (d_stream.total_out - bytes_out), outdiskfile) 
	    != (d_stream.total_out - bytes_out)) {
            inflateEnd(&d_stream);
            free(infilebuff);
            free(outfilebuff);
            return(*status = 414);
        }
    }

    free(infilebuff); /* free temporary output data buffer */
    free(outfilebuff); /* free temporary output data buffer */

    err = inflateEnd(&d_stream); /* End the decompression */
    if (err != Z_OK) return(*status = 414);
  
    return(*status);
}